

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

bool Debug::getSourceLine(void *addr,String *file,int *line)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  usize *__nbytes;
  String local_260;
  String local_238;
  char *local_210;
  char *fileEnd;
  ssize i;
  String buf;
  undefined1 local_120 [8];
  Process process;
  String cmd;
  String bin;
  char *binaryEnd;
  undefined8 local_90;
  void *relAddr;
  char *local_80;
  char *addrEnd;
  char *local_68;
  char *addrStart;
  String addrStr;
  char **addrStrs;
  void *addrs [1];
  int *line_local;
  String *file_local;
  void *addr_local;
  
  addrStrs = (char **)addr;
  addrs[0] = line;
  addrStr._data.ref = backtrace_symbols(&addrStrs,1);
  if ((long *)addrStr._data.ref == (long *)0x0) {
    addr_local._7_1_ = false;
  }
  else if (*(long *)addrStr._data.ref == 0) {
    free((void *)addrStr._data.ref);
    addr_local._7_1_ = false;
  }
  else {
    String::fromCString((String *)&addrStart,*(char **)addrStr._data.ref);
    free((void *)addrStr._data.ref);
    local_68 = String::findLast((String *)&addrStart,'[');
    local_80 = String::findLast((String *)&addrStart,']');
    if (((local_68 == (char *)0x0) || (local_80 == (char *)0x0)) || (local_80 < local_68)) {
      addr_local._7_1_ = false;
      relAddr._4_4_ = 1;
    }
    else {
      pcVar2 = local_68 + 1;
      local_68 = pcVar2;
      pcVar3 = String::operator_cast_to_char_((String *)&addrStart);
      String::substr((String *)&binaryEnd,(String *)&addrStart,(long)pcVar2 - (long)pcVar3,
                     (long)local_80 - (long)local_68);
      iVar1 = String::scanf((String *)&binaryEnd,"%p",&local_90);
      String::~String((String *)&binaryEnd);
      if (iVar1 == 1) {
        pcVar2 = String::findLast((String *)&addrStart,'(');
        if (pcVar2 == (char *)0x0) {
          addr_local._7_1_ = false;
          relAddr._4_4_ = 1;
        }
        else {
          pcVar3 = String::operator_cast_to_char_((String *)&addrStart);
          String::substr((String *)&cmd._data.ref,(String *)&addrStart,0,(long)pcVar2 - (long)pcVar3
                        );
          pcVar2 = String::operator_cast_to_char_((String *)&cmd._data.ref);
          String::fromPrintf((String *)&process.fdStdInWrite,"addr2line -e \"%s\" %p",pcVar2,
                             local_90);
          Process::Process((Process *)local_120);
          Map<String,_String>::Map((Map<String,_String> *)&buf._data.ref);
          __nbytes = &buf._data.ref;
          iVar1 = Process::open((Process *)local_120,(char *)&process.fdStdInWrite,1);
          Map<String,_String>::~Map((Map<String,_String> *)&buf._data.ref);
          if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
            String::String((String *)&i);
            String::reserve((String *)&i,0x8000);
            pcVar2 = String::operator_cast_to_char_((String *)&i);
            fileEnd = (char *)Process::read((Process *)local_120,(int)pcVar2,(void *)0x8000,
                                            (size_t)__nbytes);
            if ((long)fileEnd < 0) {
              addr_local._7_1_ = false;
            }
            else {
              String::resize((String *)&i,(usize)fileEnd);
              pcVar2 = String::findLast((String *)&i,':');
              local_210 = pcVar2;
              if (pcVar2 == (char *)0x0) {
                addr_local._7_1_ = false;
              }
              else {
                pcVar3 = String::operator_cast_to_char_((String *)&i);
                String::substr(&local_238,(String *)&i,0,(long)pcVar2 - (long)pcVar3);
                String::operator=(file,&local_238);
                String::~String(&local_238);
                pcVar2 = local_210;
                pcVar3 = String::operator_cast_to_char_((String *)&i);
                String::substr(&local_260,(String *)&i,(ssize)(pcVar2 + (1 - (long)pcVar3)),-1);
                iVar1 = String::scanf(&local_260,"%d",addrs[0]);
                String::~String(&local_260);
                if (iVar1 == 1) {
                  addr_local._7_1_ = true;
                }
                else {
                  addr_local._7_1_ = false;
                }
              }
            }
            relAddr._4_4_ = 1;
            String::~String((String *)&i);
          }
          else {
            addr_local._7_1_ = false;
            relAddr._4_4_ = 1;
          }
          Process::~Process((Process *)local_120);
          String::~String((String *)&process.fdStdInWrite);
          String::~String((String *)&cmd._data.ref);
        }
      }
      else {
        addr_local._7_1_ = false;
        relAddr._4_4_ = 1;
      }
    }
    String::~String((String *)&addrStart);
  }
  return addr_local._7_1_;
}

Assistant:

bool Debug::getSourceLine(void* addr, String& file, int& line)
{
#ifdef _WIN32
  typedef BOOL (WINAPI *PSymInitialize)(HANDLE hProcess, PCSTR UserSearchPath, BOOL fInvadeProcess);
  typedef BOOL (WINAPI *PSymGetLineFromAddr64)(HANDLE hProcess, DWORD64 qwAddr, PDWORD pdwDisplacement, PIMAGEHLP_LINE64 Line64);
  static PSymInitialize pSymInitialize = 0;
  static PSymGetLineFromAddr64 pSymGetLineFromAddr64 = 0;
  static bool initialized = false;
  HANDLE hProcess = GetCurrentProcess();
  if(!initialized)
  {
    initialized = true;
    HMODULE hModule = LoadLibrary("Dbghelp.dll");
    if(!hModule)
      return false;
    pSymInitialize = (PSymInitialize)GetProcAddress(hModule, "SymInitialize");
    pSymGetLineFromAddr64 = (PSymGetLineFromAddr64)GetProcAddress(hModule, "SymGetLineFromAddr64");
    if(!pSymInitialize || !pSymGetLineFromAddr64)
      return false;
    if(!pSymInitialize(hProcess, NULL, TRUE))
    {
      pSymGetLineFromAddr64 = 0;
      return false;
    }
  }
  if(!pSymGetLineFromAddr64)
    return false;
  IMAGEHLP_LINE64 ihLine;
  ihLine.SizeOfStruct = sizeof(IMAGEHLP_LINE64);
  DWORD displacement;
  if(!pSymGetLineFromAddr64(hProcess, (DWORD64)addr, &displacement, &ihLine))
    return false;
#ifdef UNICODE
  static wchar_t fileName[MAX_PATH];
  size_t len = mbstowcs(fileName, ihLine.FileName, strlen(ihLine.FileName));
  if(len == -1)
      return false;
  file = String(fileName, len);
#else
  file = String::fromCString(ihLine.FileName);
#endif
  line = ihLine.LineNumber;
  return true;
#else
  void* addrs[1];
  addrs[0] = addr;
  char** addrStrs = backtrace_symbols(addrs, 1);
  if(!addrStrs)
      return false;
  if(!*addrStrs)
  {
      free(addrStrs);
      return false;
  }
  String addrStr = String::fromCString(*addrStrs);
  free(addrStrs);
  const char* addrStart = addrStr.findLast('[');
  const char* addrEnd = addrStr.findLast(']');
  if(!addrStart ||!addrEnd || addrEnd < addrStart)
      return false;
  ++addrStart;
  void* relAddr;
  if(addrStr.substr(addrStart - (const char*)addrStr, addrEnd - addrStart).scanf("%p", &relAddr) != 1)
      return false;
  const char* binaryEnd = addrStr.findLast('(');
  if(!binaryEnd)
      return false;
  String bin = addrStr.substr(0, binaryEnd - (const char*)addrStr);
  String cmd = String::fromPrintf("addr2line -e \"%s\" %p", (const char*)bin, relAddr);
  Process process;
  if(!process.open(cmd))
      return false;
  String buf;
  buf.reserve(1024 * 32);
  ssize i = process.read((char*)buf, 1024 * 32);
  if(i < 0)
    return false;
  buf.resize(i);
  const char* fileEnd = buf.findLast(':');
  if(!fileEnd)
      return false;
  file = buf.substr(0, fileEnd - (const char*)buf);
  if(buf.substr(fileEnd - (const char*)buf + 1).scanf("%d", &line) != 1)
      return false;
  return true;
#endif
}